

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void msd_D<vector_brodnik<unsigned_char*>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,vector_brodnik<unsigned_char_*> *buckets)

{
  vector_brodnik<unsigned_char_*> *pvVar1;
  uchar *puVar2;
  uchar *puVar3;
  pointer pppuVar4;
  int iVar5;
  uint j;
  long lVar6;
  uint8_t *puVar7;
  uchar **ppuVar8;
  long lVar9;
  size_t __n;
  long lVar10;
  uint j_1;
  uchar **ppuVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  byte bVar16;
  uint i;
  size_t sVar17;
  long lVar18;
  array<unsigned_short,_256UL> bucketsize;
  ushort local_238 [260];
  
  if (n < 0x20) {
    if (1 < (long)n) {
      ppuVar8 = strings;
      do {
        iVar5 = (int)n;
        n = (size_t)(iVar5 - 1);
        puVar2 = ppuVar8[1];
        ppuVar8 = ppuVar8 + 1;
        for (ppuVar11 = ppuVar8; strings < ppuVar11; ppuVar11 = ppuVar11 + -1) {
          puVar3 = ppuVar11[-1];
          bVar15 = puVar3[depth];
          bVar16 = puVar2[depth];
          if ((bVar15 != 0) && (lVar6 = depth + 1, bVar15 == bVar16)) {
            do {
              bVar15 = puVar3[lVar6];
              bVar16 = puVar2[lVar6];
              if (bVar15 == 0) break;
              lVar6 = lVar6 + 1;
            } while (bVar15 == bVar16);
          }
          if (bVar15 <= bVar16) break;
          *ppuVar11 = puVar3;
        }
        *ppuVar11 = puVar2;
      } while (2 < iVar5);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      sVar17 = 0;
    }
    else {
      sVar17 = 0;
      ppuVar8 = strings;
      do {
        lVar6 = 0;
        do {
          *(uchar *)((long)local_238 + lVar6) = ppuVar8[lVar6][depth];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x20);
        lVar6 = 0;
        do {
          pvVar1 = buckets + *(byte *)((long)local_238 + lVar6);
          if (buckets[*(byte *)((long)local_238 + lVar6)]._left_in_block == 0) {
            vector_brodnik<unsigned_char_*>::grow(pvVar1);
          }
          puVar2 = ppuVar8[lVar6];
          ppuVar11 = pvVar1->_insertpos;
          pvVar1->_insertpos = ppuVar11 + 1;
          *ppuVar11 = puVar2;
          pvVar1->_left_in_block = pvVar1->_left_in_block - 1;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x20);
        sVar17 = sVar17 + 0x20;
        ppuVar8 = ppuVar8 + 0x20;
      } while (sVar17 < (n & 0xffffffffffffffe0));
    }
    if (sVar17 < n) {
      do {
        pvVar1 = buckets + strings[sVar17][depth];
        if (buckets[strings[sVar17][depth]]._left_in_block == 0) {
          vector_brodnik<unsigned_char_*>::grow(pvVar1);
        }
        puVar2 = strings[sVar17];
        ppuVar8 = pvVar1->_insertpos;
        pvVar1->_insertpos = ppuVar8 + 1;
        *ppuVar8 = puVar2;
        pvVar1->_left_in_block = pvVar1->_left_in_block - 1;
        sVar17 = sVar17 + 1;
      } while (n != sVar17);
    }
    puVar7 = &buckets->_superblock;
    lVar6 = 0;
    do {
      local_238[lVar6] =
           ((short)(2L << (*puVar7 & 0x3f)) -
           ((short)(int)*(size_t *)(puVar7 + -0xc) * (short)*(undefined4 *)(puVar7 + -4) +
           (short)(int)*(size_t *)(puVar7 + -0x14))) - 0x40;
      lVar6 = lVar6 + 1;
      puVar7 = puVar7 + 0x38;
    } while (lVar6 != 0x100);
    lVar6 = 0;
    lVar10 = 0;
    do {
      if (local_238[lVar6] != 0) {
        pvVar1 = buckets + lVar6;
        ppuVar8 = strings + lVar10;
        if (buckets[lVar6]._index_block.
            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            buckets[lVar6]._index_block.
            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar14 = 8;
          uVar13 = 0;
          lVar9 = 8;
          bVar15 = 0;
          do {
            if (lVar9 != 0) {
              uVar12 = uVar13;
              lVar18 = lVar9;
              do {
                pppuVar4 = (pvVar1->_index_block).
                           super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                if (uVar12 == ((long)(pvVar1->_index_block).
                                     super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pppuVar4 >>
                              3) - 1U) goto LAB_0019ab57;
                if (lVar14 != 0) {
                  memmove(ppuVar8,pppuVar4[uVar12],lVar14 * 8);
                }
                uVar12 = uVar12 + 1;
                ppuVar8 = ppuVar8 + lVar14;
                lVar18 = lVar18 + -1;
              } while (lVar18 != 0);
            }
            uVar13 = uVar13 + lVar9;
            lVar9 = lVar9 << bVar15;
            bVar15 = bVar15 ^ 1;
            lVar14 = lVar14 << bVar15;
          } while (uVar13 < (ulong)((long)(pvVar1->_index_block).
                                          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pvVar1->_index_block).
                                          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
LAB_0019ab57:
        ppuVar11 = (pvVar1->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1];
        __n = (long)pvVar1->_insertpos - (long)ppuVar11;
        if (__n != 0) {
          memmove(ppuVar8,ppuVar11,__n);
        }
        lVar10 = lVar10 + (ulong)local_238[lVar6];
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
    lVar6 = 0;
    do {
      vector_brodnik<unsigned_char_*>::clear
                ((vector_brodnik<unsigned_char_*> *)
                 ((long)&(buckets->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar6));
      lVar6 = lVar6 + 0x38;
    } while (lVar6 != 0x3800);
    uVar13 = (ulong)local_238[0];
    lVar6 = 1;
    do {
      uVar12 = (ulong)local_238[lVar6];
      if (uVar12 != 0) {
        msd_D<vector_brodnik<unsigned_char*>,unsigned_short>
                  (strings + uVar13,uVar12,depth + 1,buckets);
        uVar13 = uVar13 + uVar12;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}